

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::ProcessStatsConfig(ProcessStatsConfig *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessStatsConfig_004075d8;
  this->proc_stats_poll_ms_ = 0;
  this->proc_stats_cache_ttl_ms_ = 0;
  (this->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quirks_).
  super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->quirks_).
           super__Vector_base<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

ProcessStatsConfig::ProcessStatsConfig() = default;